

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int init(EVP_PKEY_CTX *ctx)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int extraout_EAX;
  char *__filename;
  uint *__first;
  uint *__last;
  uint *__result;
  long lVar4;
  int local_38;
  int j;
  int t;
  int s;
  int i_1;
  int i;
  uint value;
  uint v;
  uint u;
  FILE *file;
  string *inputFile_local;
  
  file = (FILE *)ctx;
  __filename = (char *)std::__cxx11::string::c_str();
  _v = fopen(__filename,"r");
  while( true ) {
    iVar3 = __isoc99_fscanf(_v,"%u,%u,%u",&value,&i,&i_1);
    if (iVar3 == -1) break;
    lVar4 = (long)inputNum;
    inputNum = inputNum + 1;
    inputs[lVar4] = value;
    lVar4 = (long)inputNum;
    inputNum = inputNum + 1;
    inputs[lVar4] = i;
  }
  __first = std::begin<unsigned_int,560010ul>(&inputs);
  __last = std::end<unsigned_int,560010ul>(&inputs);
  __result = std::begin<unsigned_int,560010ul>(&ids);
  std::copy<unsigned_int*,unsigned_int*>(__first,__last,__result);
  nodeNum = bucketSort(ids,ids + inputNum);
  for (s = 0; s < nodeNum; s = s + 1) {
    idHash[ids[s]] = s;
  }
  for (t = 0; t < inputNum; t = t + 2) {
    iVar3 = idHash[inputs[t]];
    iVar1 = idHash[inputs[t + 1]];
    iVar2 = outDegrees[iVar3];
    outDegrees[iVar3] = iVar2 + 1;
    G[iVar3][iVar2] = iVar1;
    iVar2 = inDegrees[iVar1];
    inDegrees[iVar1] = iVar2 + 1;
    Ginv[iVar1][iVar2] = iVar3;
  }
  for (local_38 = 0; local_38 < nodeNum; local_38 = local_38 + 1) {
    std::sort<int*>(G[local_38],G[local_38] + outDegrees[local_38]);
    std::sort<int*>(Ginv[local_38],Ginv[local_38] + inDegrees[local_38]);
  }
  std::
  vector<std::unordered_map<int,_std::vector<int,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::unordered_map<int,_std::vector<int,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>
  ::resize(&pre,0x445c5);
  return extraout_EAX;
}

Assistant:

void init(string &inputFile) {

    FILE *file = fopen(inputFile.c_str(), "r");
    unsigned int u, v, value;
    while (fscanf(file, "%u,%u,%u", &u, &v, &value) != EOF) {
        inputs[inputNum++] = u;
        inputs[inputNum++] = v;
    }

//    unsigned int u, v;
//    int fd = open(inputFile.c_str(),O_RDONLY);
//    int len = lseek(fd,0,SEEK_END);
//    char *buf = (char *) mmap(NULL,len,PROT_READ,MAP_PRIVATE,fd,0);
//    int offset = 0;
//    while (true){
//        next(buf, offset, u, v);
//        if (offset != -1){
//            inputs[inputNum++] = u;
//            inputs[inputNum++] = v;
//        } else{
//            break;
//        }
//    }

    copy(begin(inputs), end(inputs), begin(ids));
//    sort(ids, ids + inputNum);
//    nodeNum = unique(ids, ids + inputNum) - ids;
    nodeNum = bucketSort(ids, ids + inputNum);
    for (int i = 0; i < nodeNum; i++) {
        idHash[ids[i]] = i;
    }
    for (int i = 0; i < inputNum; i += 2) {
        int s = idHash[inputs[i]], t = idHash[inputs[i + 1]];
        G[s][outDegrees[s]++] = t;
        Ginv[t][inDegrees[t]++] = s;
    }
    for (int j = 0; j < nodeNum; ++j) {
        sort(G[j], G[j] + outDegrees[j]);
        sort(Ginv[j], Ginv[j] + inDegrees[j]);
    }
    pre.resize(maxSize);
}